

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

int __thiscall
QtMWidgets::NavigationBar::addWidget
          (NavigationBar *this,QWidget *parent,QString *title,QWidget *widget)

{
  Type *pTVar1;
  Data *dd;
  Data *dd_00;
  bool bVar2;
  int iVar3;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar4;
  Type *this_00;
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QSharedPointer<QtMWidgets::NavigationItem> local_50;
  QWidget *local_40;
  QWidget *local_38;
  
  local_40 = widget;
  local_38 = parent;
  bVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&local_38);
  iVar3 = -1;
  if (bVar2) {
    iVar3 = QStackedWidget::addWidget((QWidget *)((this->d).d)->stack);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&local_38);
    pTVar1 = pQVar4->value;
    dd = pQVar4->d;
    if (dd != (Data *)0x0) {
      LOCK();
      (dd->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this_00 = (Type *)operator_new(0x40);
    (this_00->children).d.size = 0;
    this_00->parent = (NavigationItem *)0x0;
    (this_00->children).d.d = (Data *)0x0;
    (this_00->children).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
    (this_00->title).d.size = 0;
    this_00->self = (QWidget *)0x0;
    (this_00->title).d.d = (Data *)0x0;
    (this_00->title).d.ptr = (char16_t *)0x0;
    local_50.value = this_00;
    local_50.d = (Data *)operator_new(0x18);
    *(Type **)(local_50.d + 1) = this_00;
    (local_50.d)->destroyer =
         QtSharedPointer::
         ExternalRefCountWithCustomDeleter<QtMWidgets::NavigationItem,_QtSharedPointer::NormalDeleter>
         ::deleter;
    ((local_50.d)->strongref)._q_value.super___atomic_base<int>._M_i = 1;
    ((local_50.d)->weakref)._q_value.super___atomic_base<int>._M_i = 1;
    QString::operator=((QString *)this_00,title);
    this_00->parent = pTVar1;
    this_00->self = local_40;
    QtPrivate::QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>>::
    emplace<QSharedPointer<QtMWidgets::NavigationItem>const&>
              ((QMovableArrayOps<QSharedPointer<QtMWidgets::NavigationItem>> *)&pTVar1->children,
               (pTVar1->children).d.size,&local_50);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&local_40);
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_50.d)->strongref)._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    dd_00 = pQVar4->d;
    pQVar4->d = local_50.d;
    pQVar4->value = local_50.value;
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(local_50.d);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  }
  return iVar3;
}

Assistant:

int
NavigationBar::addWidget( QWidget * parent, const QString & title,
	QWidget * widget )
{
	int index = -1;

	if( d->itemsMap.contains( parent ) )
	{
		index = d->stack->addWidget( widget );

		QSharedPointer< NavigationItem > pp = d->itemsMap[ parent ];

		QSharedPointer< NavigationItem > item( new NavigationItem );
		item->title = title;
		item->parent = pp.data();
		item->self = widget;

		pp->children.append( item );
		d->itemsMap[ widget ] = item;
	}

	return index;
}